

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfd.h
# Opt level: O0

string * __thiscall pfd::internal::file_dialog::string_result_abi_cxx11_(file_dialog *this)

{
  char *pcVar1;
  string *in_RDI;
  bool bVar2;
  string *ret;
  string *this_00;
  executor *in_stack_ffffffffffffffb8;
  string local_38 [39];
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  std::__shared_ptr_access<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1c2bea);
  executor::result_abi_cxx11_(in_stack_ffffffffffffffb8,(int *)this_00);
  while( true ) {
    pcVar1 = (char *)std::__cxx11::string::back();
    bVar2 = true;
    if (*pcVar1 != '\n') {
      pcVar1 = (char *)std::__cxx11::string::back();
      bVar2 = *pcVar1 == '/';
    }
    if (!bVar2) break;
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_38,(ulong)this_00);
    std::__cxx11::string::operator=((string *)this_00,local_38);
    std::__cxx11::string::~string(local_38);
  }
  return in_RDI;
}

Assistant:

inline std::string internal::file_dialog::string_result()
{
#if _WIN32
    return m_async->result();
#else
    auto ret = m_async->result();
    // Strip potential trailing newline (zenity). Also strip trailing slash
    // added by osascript for consistency with other backends.
    while (ret.back() == '\n' || ret.back() == '/')
        ret = ret.substr(0, ret.size() - 1);
    return ret;
#endif
}